

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::LICMPass::AnalyseAndHoistFromBB
          (LICMPass *this,Loop *loop,Function *f,BasicBlock *bb,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *loop_bbs)

{
  pointer *pppBVar1;
  BasicBlock **__args;
  iterator __position;
  BasicBlock *pBVar2;
  Loop *pLVar3;
  bool bVar4;
  char cVar5;
  _Rb_tree_color _Var6;
  uint32_t uVar7;
  DominatorAnalysis *pDVar8;
  size_type sVar9;
  _Base_ptr p_Var10;
  _Base_ptr *pp_Var11;
  _Base_ptr p_Var12;
  Instruction *pIVar13;
  Status SVar14;
  Instruction *pIVar15;
  _Rb_tree_header *p_Var16;
  bool modified;
  function<bool_(spvtools::opt::Instruction_*)> hoist_inst;
  byte local_81;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  LICMPass *local_50;
  Function *local_48;
  BasicBlock *local_40;
  Loop *local_38;
  
  local_81 = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78 = (undefined8 *)0x0;
  uStack_70 = 0;
  local_40 = bb;
  local_38 = loop;
  local_78 = (undefined8 *)operator_new(0x18);
  pBVar2 = local_40;
  *local_78 = this;
  local_78[1] = &local_38;
  local_78[2] = &local_81;
  pcStack_60 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/licm_pass.cpp:86:7)>
             ::_M_manager;
  local_50 = this;
  local_48 = f;
  bVar4 = IsImmediatelyContainedInLoop(this,loop,f,local_40);
  if (bVar4) {
    pIVar13 = (pBVar2->label_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar13 != (Instruction *)0x0) {
      local_80._M_head_impl = pIVar13;
      if (local_68 == (code *)0x0) {
LAB_0023f08c:
        std::__throw_bad_function_call();
      }
      cVar5 = (*pcStack_60)(&local_78,&local_80);
      SVar14 = Failure;
      if (cVar5 == '\0') goto LAB_0023f061;
    }
    pIVar13 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar13 != (Instruction *)0x0) &&
       ((pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      do {
        if (pIVar13 == (Instruction *)0x0) goto LAB_0023ef6d;
        pIVar15 = (pIVar13->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        local_80._M_head_impl = pIVar13;
        if (local_68 == (code *)0x0) goto LAB_0023f08c;
        SVar14 = Failure;
        if ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar15 = (Instruction *)0x0;
        }
        cVar5 = (*pcStack_60)(&local_78,&local_80);
        pIVar13 = pIVar15;
      } while (cVar5 != '\0');
      goto LAB_0023f061;
    }
  }
LAB_0023ef6d:
  pDVar8 = IRContext::GetDominatorAnalysis((local_50->super_Pass).context_,local_48);
  pIVar13 = (pBVar2->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  _Var6 = _S_red;
  if (pIVar13->has_result_id_ == true) {
    _Var6 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
  }
  p_Var16 = &(pDVar8->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = *(_Base_ptr *)
             ((long)&(pDVar8->super_DominatorAnalysisBase).tree_.nodes_._M_t._M_impl.
                     super__Rb_tree_header._M_header + 8);
  p_Var10 = &p_Var16->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[bVar4]) {
    bVar4 = p_Var12[1]._M_color < _Var6;
    if (!bVar4) {
      p_Var10 = p_Var12;
    }
  }
  p_Var12 = &p_Var16->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var16) && (p_Var12 = p_Var10, _Var6 < p_Var10[1]._M_color)) {
    p_Var12 = &p_Var16->_M_header;
  }
  pp_Var11 = (_Base_ptr *)0x0;
  if ((_Rb_tree_header *)p_Var12 != p_Var16) {
    pp_Var11 = &p_Var12[1]._M_parent;
  }
  p_Var12 = pp_Var11[2];
  p_Var10 = pp_Var11[3];
  if (p_Var12 != p_Var10) {
    do {
      pLVar3 = local_38;
      __args = *(BasicBlock ***)p_Var12;
      pIVar13 = ((*__args)->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar7 = 0;
      if (pIVar13->has_result_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar13,(uint)pIVar13->has_type_id_);
      }
      local_80._M_head_impl._0_4_ = uVar7;
      sVar9 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(pLVar3->loop_basic_blocks_)._M_h,(key_type_conflict *)&local_80);
      if (sVar9 != 0) {
        __position._M_current =
             (loop_bbs->
             super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (loop_bbs->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
          _M_realloc_insert<spvtools::opt::BasicBlock*const&>
                    ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                      *)loop_bbs,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          pppBVar1 = &(loop_bbs->
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppBVar1 = *pppBVar1 + 1;
        }
      }
      p_Var12 = (_Base_ptr)&p_Var12->_M_parent;
    } while (p_Var12 != p_Var10);
  }
  SVar14 = local_81 ^ SuccessWithoutChange;
LAB_0023f061:
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  return SVar14;
}

Assistant:

Pass::Status LICMPass::AnalyseAndHoistFromBB(
    Loop* loop, Function* f, BasicBlock* bb,
    std::vector<BasicBlock*>* loop_bbs) {
  bool modified = false;
  std::function<bool(Instruction*)> hoist_inst =
      [this, &loop, &modified](Instruction* inst) {
        if (loop->ShouldHoistInstruction(*inst)) {
          if (!HoistInstruction(loop, inst)) {
            return false;
          }
          modified = true;
        }
        return true;
      };

  if (IsImmediatelyContainedInLoop(loop, f, bb)) {
    if (!bb->WhileEachInst(hoist_inst, false)) {
      return Status::Failure;
    }
  }

  DominatorAnalysis* dom_analysis = context()->GetDominatorAnalysis(f);
  DominatorTree& dom_tree = dom_analysis->GetDomTree();

  for (DominatorTreeNode* child_dom_tree_node : *dom_tree.GetTreeNode(bb)) {
    if (loop->IsInsideLoop(child_dom_tree_node->bb_)) {
      loop_bbs->push_back(child_dom_tree_node->bb_);
    }
  }

  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}